

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

MPP_RET reader_read(FileReader reader,FileBufSlot **buf)

{
  FileBufSlot *pFVar1;
  
  if ((reader == (FileReader)0x0) || (*(long *)((long)reader + 0x70) == 0)) {
    _mpp_log_l(4,"mpi_dec_utils","invalid reader %p\n","reader_read",reader);
  }
  else {
    if (*(uint *)((long)reader + 0x6c) < *(uint *)((long)reader + 100)) {
      do {
        pFVar1 = *(FileBufSlot **)
                  (*(long *)((long)reader + 0x70) + (ulong)*(uint *)((long)reader + 0x6c) * 8);
        if ((pFVar1 == (FileBufSlot *)0x0) ||
           (*(uint *)((long)reader + 0x68) < *(uint *)((long)reader + 0x6c))) {
          usleep(1000);
        }
      } while (pFVar1 == (FileBufSlot *)0x0);
      *buf = pFVar1;
      *(int *)((long)reader + 0x6c) = *(int *)((long)reader + 0x6c) + 1;
      return MPP_OK;
    }
    _mpp_log_l(4,"mpi_dec_utils","invalid read index % max %d\n","reader_read");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET reader_read(FileReader reader, FileBufSlot **buf)
{
    FileReaderImpl *impl = (FileReaderImpl*)reader;
    FileBufSlot *slot = NULL;

    if (NULL == impl || NULL == impl->slots) {
        mpp_log_f("invalid reader %p\n", reader);
        return MPP_NOK;
    }

    if (impl->slot_rd_idx >= impl->slot_max) {
        mpp_log_f("invalid read index % max %d\n", impl->slot_rd_idx, impl->slot_max);
        return MPP_NOK;
    }

    do {
        slot = impl->slots[impl->slot_rd_idx];
        if (slot == NULL || (impl->slot_rd_idx > impl->slot_cnt))
            msleep(1);
    } while (slot == NULL);

    mpp_assert(slot);

    *buf  = slot;
    impl->slot_rd_idx++;

    return MPP_OK;
}